

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BamToolsIndex_p.cpp
# Opt level: O0

void __thiscall
BamTools::Internal::BamToolsIndex::LoadReferenceSummary
          (BamToolsIndex *this,BtiReferenceSummary *refSummary)

{
  int64_t iVar1;
  undefined4 *in_RSI;
  BamToolsIndex *in_RDI;
  int numBlocks;
  int *in_stack_00000058;
  BamToolsIndex *in_stack_00000060;
  int *in_stack_ffffffffffffffd8;
  undefined4 local_14;
  
  LoadNumBlocks(in_stack_00000060,in_stack_00000058);
  *in_RSI = local_14;
  iVar1 = Tell((BamToolsIndex *)0x2de7c7);
  *(int64_t *)(in_RSI + 2) = iVar1;
  SkipBlocks(in_RDI,in_stack_ffffffffffffffd8);
  return;
}

Assistant:

void BamToolsIndex::LoadReferenceSummary(BtiReferenceSummary& refSummary)
{

    // load number of blocks
    int numBlocks;
    LoadNumBlocks(numBlocks);

    // store block summary data for this reference
    refSummary.NumBlocks = numBlocks;
    refSummary.FirstBlockFilePosition = Tell();

    // skip reference's blocks
    SkipBlocks(numBlocks);
}